

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O0

void * CharacterUnion::UnPack(void *obj,Character type,resolver_function_t *resolver)

{
  uint uVar1;
  string *psVar2;
  char *pcVar3;
  allocator local_69;
  Vector<char,_unsigned_int> *local_68;
  String *ptr_5;
  Vector<char,_unsigned_int> *local_50;
  String *ptr_4;
  BookReader *ptr_3;
  BookReader *ptr_2;
  Rapunzel *ptr_1;
  Attacker *ptr;
  resolver_function_t *resolver_local;
  void *pvStack_18;
  Character type_local;
  void *obj_local;
  
  ptr = (Attacker *)resolver;
  resolver_local._7_1_ = type;
  pvStack_18 = obj;
  switch(type) {
  case Character_MuLan:
    ptr_1 = (Rapunzel *)obj;
    obj_local = Attacker::UnPack((Attacker *)obj,resolver);
    break;
  case Character_Rapunzel:
    ptr_2 = (BookReader *)obj;
    obj_local = operator_new(4);
    *(int32_t *)obj_local = ptr_2->books_read_;
    break;
  case Character_Belle:
    ptr_3 = (BookReader *)obj;
    obj_local = operator_new(4);
    *(int32_t *)obj_local = ptr_3->books_read_;
    break;
  case Character_BookFan:
    ptr_4 = (String *)obj;
    obj_local = operator_new(4);
    *(String *)obj_local = *ptr_4;
    break;
  case Character_Other:
    local_50 = (Vector<char,_unsigned_int> *)obj;
    psVar2 = (string *)operator_new(0x20);
    ptr_5._2_1_ = 1;
    pcVar3 = flatbuffers::String::c_str((String *)local_50);
    uVar1 = flatbuffers::Vector<char,_unsigned_int>::size(local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar2,pcVar3,(ulong)uVar1,(allocator *)((long)&ptr_5 + 3));
    ptr_5._2_1_ = 0;
    obj_local = psVar2;
    std::allocator<char>::~allocator((allocator<char> *)((long)&ptr_5 + 3));
    break;
  case Character_MAX:
    local_68 = (Vector<char,_unsigned_int> *)obj;
    psVar2 = (string *)operator_new(0x20);
    pcVar3 = flatbuffers::String::c_str((String *)local_68);
    uVar1 = flatbuffers::Vector<char,_unsigned_int>::size(local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar2,pcVar3,(ulong)uVar1,&local_69);
    obj_local = psVar2;
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    break;
  default:
    obj_local = (void *)0x0;
  }
  return obj_local;
}

Assistant:

inline void *CharacterUnion::UnPack(const void *obj, Character type, const ::flatbuffers::resolver_function_t *resolver) {
  (void)resolver;
  switch (type) {
    case Character_MuLan: {
      auto ptr = reinterpret_cast<const Attacker *>(obj);
      return ptr->UnPack(resolver);
    }
    case Character_Rapunzel: {
      auto ptr = reinterpret_cast<const Rapunzel *>(obj);
      return new Rapunzel(*ptr);
    }
    case Character_Belle: {
      auto ptr = reinterpret_cast<const BookReader *>(obj);
      return new BookReader(*ptr);
    }
    case Character_BookFan: {
      auto ptr = reinterpret_cast<const BookReader *>(obj);
      return new BookReader(*ptr);
    }
    case Character_Other: {
      auto ptr = reinterpret_cast<const ::flatbuffers::String *>(obj);
      return new std::string(ptr->c_str(), ptr->size());
    }
    case Character_Unused: {
      auto ptr = reinterpret_cast<const ::flatbuffers::String *>(obj);
      return new std::string(ptr->c_str(), ptr->size());
    }
    default: return nullptr;
  }
}